

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O0

void __thiscall argparse::args_t::parse_output(args_t *this,char *str)

{
  int iVar1;
  FILE *pFVar2;
  char *in_RSI;
  long in_RDI;
  
  if (in_RSI != (char *)0x0) {
    iVar1 = strcmp(in_RSI,"-");
    if (iVar1 != 0) {
      pFVar2 = fopen(in_RSI,"wb");
      *(FILE **)(in_RDI + 0x10) = pFVar2;
      goto LAB_00111c15;
    }
  }
  *(undefined8 *)(in_RDI + 0x10) = _stdout;
LAB_00111c15:
  if (*(long *)(in_RDI + 0x10) == 0) {
    ERROR("failed to open the OUTPUT file %s",in_RSI);
  }
  return;
}

Assistant:

void args_t::parse_output( const char * str ) {
        if ( str && strcmp( str, "-" ) )
            output = fopen( str, "wb" );
        else
            output = stdout;
        
        if ( output == NULL )
            ERROR( "failed to open the OUTPUT file %s", str );
    }